

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

ostream * tcu::operator<<(ostream *str,CubeFace face)

{
  ostream *poVar1;
  char *pcVar2;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    pcVar2 = "CUBEFACE_NEGATIVE_X";
    break;
  case CUBEFACE_POSITIVE_X:
    pcVar2 = "CUBEFACE_POSITIVE_X";
    break;
  case CUBEFACE_NEGATIVE_Y:
    pcVar2 = "CUBEFACE_NEGATIVE_Y";
    break;
  case CUBEFACE_POSITIVE_Y:
    pcVar2 = "CUBEFACE_POSITIVE_Y";
    break;
  case CUBEFACE_NEGATIVE_Z:
    pcVar2 = "CUBEFACE_NEGATIVE_Z";
    break;
  case CUBEFACE_POSITIVE_Z:
    pcVar2 = "CUBEFACE_POSITIVE_Z";
    break;
  case CUBEFACE_LAST:
    pcVar2 = "CUBEFACE_LAST";
    break;
  default:
    poVar1 = std::operator<<(str,"UNKNOWN(");
    str = (ostream *)std::ostream::operator<<(poVar1,face);
    pcVar2 = ")";
  }
  poVar1 = std::operator<<(str,pcVar2);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, CubeFace face)
{
	switch (face)
	{
		case CUBEFACE_NEGATIVE_X:	return str << "CUBEFACE_NEGATIVE_X";
		case CUBEFACE_POSITIVE_X:	return str << "CUBEFACE_POSITIVE_X";
		case CUBEFACE_NEGATIVE_Y:	return str << "CUBEFACE_NEGATIVE_Y";
		case CUBEFACE_POSITIVE_Y:	return str << "CUBEFACE_POSITIVE_Y";
		case CUBEFACE_NEGATIVE_Z:	return str << "CUBEFACE_NEGATIVE_Z";
		case CUBEFACE_POSITIVE_Z:	return str << "CUBEFACE_POSITIVE_Z";
		case CUBEFACE_LAST:			return str << "CUBEFACE_LAST";
		default:					return str << "UNKNOWN(" << (int)face << ")";
	}
}